

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O3

int __thiscall caldate_t::iso_weekno(caldate_t *this,int *year)

{
  long lVar1;
  int32_t iVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  caldate_t jan1;
  caldate_t this_thu;
  caldate_t local_30;
  caldate_t local_24;
  
  uVar5 = (uint)((long)this->m < 3);
  iVar8 = this->y - uVar5;
  iVar6 = (this->y - uVar5) + 3;
  if (-1 < iVar8) {
    iVar6 = iVar8;
  }
  iVar9 = (int)((ulong)((long)iVar8 * -0x51eb851f) >> 0x20);
  iVar8 = (iVar8 + this->d + *(int *)("12julcaldate_t" + (long)this->m * 4 + 0xd) + (iVar6 >> 2) +
           ((iVar9 >> 5) - (iVar9 >> 0x1f)) + iVar8 / 400) % 7;
  iVar2 = dayno(this);
  iVar6 = 6;
  if (iVar8 != 0) {
    iVar6 = iVar8 + -1;
  }
  iVar6 = (iVar2 - iVar6) + 3;
  set_dayno(&local_24,iVar6);
  if (year != (int *)0x0) {
    *year = local_24.y;
  }
  local_30.y = local_24.y;
  local_30.m = 1;
  local_30.d = 1;
  iVar8 = local_24.y + -1;
  iVar9 = local_24.y + 2;
  if (-1 < iVar8) {
    iVar9 = iVar8;
  }
  iVar7 = (int)((ulong)((long)iVar8 * -0x51eb851f) >> 0x20);
  iVar8 = (iVar9 >> 2) + local_24.y + ((iVar7 >> 5) - (iVar7 >> 0x1f)) + iVar8 / 400;
  lVar1 = (long)iVar8 * 0x92492493;
  iVar2 = dayno(&local_30);
  bVar3 = 0xb - (((char)(uint)((ulong)lVar1 >> 0x22) - (char)(lVar1 >> 0x3f)) * -7 + (char)iVar8);
  cVar4 = (char)((uint)bVar3 * 0x25 >> 8);
  return (int)(iVar6 - ((uint)(byte)(bVar3 + ((byte)(((byte)(bVar3 - cVar4) >> 1) + cVar4) >> 2) *
                                             -7) + iVar2)) / 7 + 1;
}

Assistant:

int iso_weekno(int *year) const
    {
        /* 
         *   Find the Thursday of the current ISO week.  To do this, figure
         *   our weekday, subtract the ISO weekday number minus 1 to get the
         *   nearest preceding Monday (the start of the ISO week), then add 3
         *   to get the following Thursday.  The year containing the Thursday
         *   of a given week is by definition the year which that whole week
         *   (starting on Monday) belongs to.
         */
        int wday = iso_weekday();
        int32_t this_thu_dayno = dayno() - (wday-1) + 3;
        caldate_t this_thu(this_thu_dayno);

        /* the year containing the Thursday is the week's calendar year */
        if (year != 0)
            *year = this_thu.y;

        /*
         *   Find the first Thursday of the calendar year we just calculated.
         *   ISO week 1 of a given calendar year is the week that contains
         *   the first Thursday of the year.  So find the first Thursday on
         *   or after Jan 1.
         */
        caldate_t jan1(this_thu.y, 1, 1);
        int jan1_wday = jan1.weekday();
        int32_t first_thu_dayno = jan1.dayno() + ((11 - jan1_wday) % 7);

        /*
         *   Calculate the number of weeks (== the number of days divided by
         *   seven) between the Thursday of the target week and the Thursday
         *   of the first week.  This gives us the difference in week
         *   numbers; since the first week is week #1, adding 1 to the
         *   difference gives us the target week number.
         */
        return ((this_thu_dayno - first_thu_dayno)/7) + 1;
    }